

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtils.cpp
# Opt level: O0

string * Lib::StringUtils::sanitizeSuffix(string *str)

{
  ulong uVar1;
  int iVar2;
  char *pcVar3;
  string *in_RDI;
  char c;
  char *tptr;
  char *sptr;
  size_t len;
  size_t in_stack_ffffffffffffff98;
  allocator *paVar4;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  string *this;
  allocator local_3a;
  char local_39;
  char *local_38;
  char *local_30;
  ulong local_18;
  
  this = in_RDI;
  local_18 = std::__cxx11::string::size();
  if ((sanitizeSuffix(std::__cxx11::string)::buf == '\0') &&
     (iVar2 = __cxa_guard_acquire(&sanitizeSuffix(std::__cxx11::string)::buf), iVar2 != 0)) {
    DArray<char>::DArray
              ((DArray<char> *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               in_stack_ffffffffffffff98);
    __cxa_atexit(DArray<char>::~DArray,&sanitizeSuffix::buf,&__dso_handle);
    __cxa_guard_release(&sanitizeSuffix(std::__cxx11::string)::buf);
  }
  DArray<char>::ensure((DArray<char> *)this,(size_t)in_RDI);
  local_30 = (char *)std::__cxx11::string::c_str();
  local_38 = DArray<char>::array(&sanitizeSuffix::buf);
  for (; *local_30 != '\0'; local_30 = local_30 + 1) {
    local_39 = *local_30;
    iVar2 = (int)local_39;
    if ((((iVar2 == 0x22) || (iVar2 - 0x24U < 2)) || (iVar2 - 0x27U < 3)) ||
       ((iVar2 == 0x2c || (iVar2 == 0x2e)))) {
      local_39 = '_';
    }
    *local_38 = local_39;
    local_38 = local_38 + 1;
  }
  pcVar3 = DArray<char>::array(&sanitizeSuffix::buf);
  uVar1 = local_18;
  paVar4 = &local_3a;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,pcVar3,uVar1,paVar4);
  std::allocator<char>::~allocator((allocator<char> *)&local_3a);
  return this;
}

Assistant:

std::string StringUtils::sanitizeSuffix(std::string str)
{
  size_t len=str.size();
  static DArray<char> buf;
  buf.ensure(len);

  const char* sptr=str.c_str();
  char* tptr=buf.array();

  while(*sptr) {
    char c = *sptr;

    switch(c) {
    case '(':
    case ')':
    case '"':
    case '\'':
    case '$':
    case '%':
    case ',':
    case '.':
      c = '_';
      break;
    default: break;
    }

    *tptr = c;
    tptr++;
    sptr++;
  }
  return std::string(buf.array(), len);
}